

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumFloatArray(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  VRDatumFloatArray *obj;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  VRDatum *in_stack_ffffffffffffffc8;
  VRDatumPtr *in_stack_ffffffffffffffd0;
  VRFloatArray *in_stack_ffffffffffffffd8;
  VRDatumFloatArray *in_stack_ffffffffffffffe0;
  VRDatum_conflict *__x;
  
  __x = in_RDI;
  operator_new(0x68);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::vector<float,_std::allocator<float>_>::vector
            (unaff_retaddr,(vector<float,_std::allocator<float>_> *)__x);
  VRDatumFloatArray::VRDatumFloatArray(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar2) & 0xffffffff00ffffff));
  VRDatumPtr::VRDatumPtr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumFloatArray(void *pData) {
  VRDatumFloatArray *obj =
    new VRDatumFloatArray(*static_cast<VRFloatArray *>(pData));
  return VRDatumPtr(obj);
}